

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

double __thiscall
vkt::shaderexecutor::Functions::Div::precision
          (Div *this,EvalContext *ctx,double ret,double param_3,double den)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = 0.0;
  if ((den != 0.0) || (NAN(den))) {
    uVar1 = -(ulong)(-den <= den);
    dVar5 = (double)(~uVar1 & (ulong)-den | (ulong)den & uVar1);
    dVar3 = ldexp(1.0,(ctx->format).m_minExp);
    dVar4 = ldexp(1.0,(ctx->format).m_maxExp + -1);
    dVar2 = INFINITY;
    if ((dVar3 <= dVar5) && (dVar5 < dVar4)) {
      dVar2 = tcu::FloatFormat::ulp(&ctx->format,ret,2.5);
      return dVar2;
    }
  }
  return dVar2;
}

Assistant:

double		precision		(const EvalContext& ctx, double ret, double, double den) const
	{
		const FloatFormat&	fmt		= ctx.format;

		// \todo [2014-03-05 lauri] Check that the limits in GLSL 3.10 are actually correct.
		// For now, we assume that division's precision is 2.5 ULP when the value is within
		// [2^MINEXP, 2^MAXEXP-1]

		if (den == 0.0)
			return 0.0; // Result must be exactly inf
		else if (de::inBounds(deAbs(den),
							  deLdExp(1.0, fmt.getMinExp()),
							  deLdExp(1.0, fmt.getMaxExp() - 1)))
			return fmt.ulp(ret, 2.5);
		else
			return TCU_INFINITY; // Can be any number, but must be a number.
	}